

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chase.cpp
# Opt level: O1

void __thiscall AStarSolver::addToList(AStarSolver *this,int x,int y,coord origin,int base_score)

{
  _Rb_tree_header *p_Var1;
  map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
  *this_00;
  list<int,_std::allocator<int>_> *plVar2;
  size_t *psVar3;
  ItemThing *pIVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  mapped_type *pmVar8;
  _List_node_base *this_01;
  int iVar9;
  int iVar10;
  _Base_ptr p_Var11;
  int iVar12;
  _Base_ptr p_Var13;
  _List_node_base *p_Var14;
  int iVar15;
  int pos;
  int p;
  uint local_40;
  uint local_3c;
  coord local_38;
  
  if ((uint)y < 0x20 && (uint)x < 0x50) {
    uVar6 = x << 5 | y;
    if (places[uVar6].p_ch == 0x18) {
      if ((places[uVar6].p_flags & 0x20) != 0) {
        return;
      }
      base_score = base_score + 2;
    }
    else {
      iVar7 = step_ok((int)places[uVar6].p_ch);
      if (iVar7 == 0) {
        return;
      }
    }
    iVar7 = base_score + 4;
    if (places[uVar6].p_monst == (MonsterThing *)0x0) {
      iVar7 = base_score;
    }
    pIVar4 = places[uVar6].p_item;
    if (((pIVar4 == (ItemThing *)0x0) || (pIVar4->type != 8)) || (pIVar4->which != 10)) {
      local_40 = y << 0x10 | x;
      p_Var1 = &(this->info)._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = (this->info)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      for (; p_Var13 != (_Base_ptr)0x0;
          p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < (int)local_40]) {
        if ((int)local_40 <= (int)p_Var13[1]._M_color) {
          p_Var11 = p_Var13;
        }
      }
      p_Var13 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var13 = p_Var11, (int)local_40 < (int)p_Var11[1]._M_color)) {
        p_Var13 = &p_Var1->_M_header;
      }
      this_00 = &this->info;
      local_38 = origin;
      if (((_Rb_tree_header *)p_Var13 == p_Var1) ||
         (pmVar8 = std::
                   map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_40), iVar7 < pmVar8->base_score)) {
        pmVar8 = std::
                 map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                 ::operator[](this_00,(key_type *)&local_40);
        pmVar8->base_score = iVar7;
        pmVar8 = std::
                 map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                 ::operator[](this_00,(key_type *)&local_40);
        pmVar8->origin = local_38;
        iVar15 = x - (this->end).x;
        iVar5 = -iVar15;
        if (0 < iVar15) {
          iVar5 = iVar15;
        }
        iVar12 = y - (this->end).y;
        iVar15 = -iVar12;
        if (0 < iVar12) {
          iVar15 = iVar12;
        }
        plVar2 = &this->open_list;
        p_Var14 = (this->open_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_next;
        if (p_Var14 != (_List_node_base *)plVar2) {
          do {
            local_3c = *(uint *)&p_Var14[1]._M_next;
            pmVar8 = std::
                     map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_3c);
            iVar10 = (local_3c & 0xffff) - (this->end).x;
            iVar12 = -iVar10;
            if (0 < iVar10) {
              iVar12 = iVar10;
            }
            iVar9 = ((int)local_3c >> 0x10) - (this->end).y;
            iVar10 = -iVar9;
            if (0 < iVar9) {
              iVar10 = iVar9;
            }
            if (iVar5 + iVar7 + iVar15 < iVar12 + pmVar8->base_score + iVar10) {
              this_01 = (_List_node_base *)operator_new(0x18);
              *(uint *)&this_01[1]._M_next = local_40;
              goto LAB_00124df2;
            }
            p_Var14 = p_Var14->_M_next;
          } while (p_Var14 != (_List_node_base *)plVar2);
        }
        this_01 = (_List_node_base *)operator_new(0x18);
        *(uint *)&this_01[1]._M_next = local_40;
        p_Var14 = (_List_node_base *)plVar2;
LAB_00124df2:
        std::__detail::_List_node_base::_M_hook(this_01,p_Var14);
        psVar3 = &(this->open_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  _M_size;
        *psVar3 = *psVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void addToList(int x, int y, coord origin, int base_score)
    {
        if (x < 0 || x >= NUMCOLS || y < 0 || y >= NUMLINES)
            return;
        if (char_at(x, y) == CLOSED_DOOR)
        {
            if (flags_at(x, y) & F_LOCKED)
                return;
            base_score += 2;
        }else{
            if (!step_ok(char_at(x, y)))
                return;
        }
        if (monster_at(x, y))
            base_score += 4;
        if (item_at(x, y) && item_at(x, y)->type == SCROLL && item_at(x, y)->which == S_SCARE)
            return;
        int pos = x | y << 16;
        if (info.find(pos) != info.end())
        {
            if (info[pos].base_score <= base_score)
                return;
        }
        info[pos].base_score = base_score;
        info[pos].origin = origin;
        
        int score = heuristicScore(x, y) + base_score;
        for(auto it=open_list.begin(); it != open_list.end(); it++)
        {
            int p = *it;
            int s = info[p].base_score + heuristicScore(p & 0xFFFF, p >> 16);
            if (score < s)
            {
                open_list.insert(it, pos);
                return;
            }
        }
        open_list.push_back(pos);
    }